

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

_Bool Curl_compareheader(char *headerline,char *header,size_t hlen,char *content,size_t clen)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *__s;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  
  iVar2 = Curl_strncasecompare(headerline,header,hlen);
  if (iVar2 != 0) {
    __s = headerline + hlen;
    pcVar5 = __s;
    for (; ((cVar1 = *__s, cVar1 == '\t' || (cVar1 == ' ')) ||
           ((cVar1 != '\0' && ((byte)(cVar1 - 10U) < 4)))); __s = __s + 1) {
      pcVar5 = pcVar5 + 1;
    }
    pcVar3 = strchr(__s,0xd);
    if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(__s,10), pcVar3 == (char *)0x0)) {
      sVar4 = strlen(__s);
      pcVar3 = __s + sVar4;
    }
    if (clen <= (ulong)((long)pcVar3 - (long)pcVar5)) {
      pcVar5 = pcVar3 + ~(ulong)pcVar5;
      do {
        iVar2 = Curl_strncasecompare(__s,content,clen);
        bVar7 = iVar2 != 0;
        if (bVar7) {
          return bVar7;
        }
        __s = __s + 1;
        bVar6 = clen <= pcVar5;
        pcVar5 = pcVar5 + -1;
      } while (bVar6);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool
Curl_compareheader(const char *headerline, /* line to check */
                   const char *header,  /* header keyword _with_ colon */
                   const size_t hlen,   /* len of the keyword in bytes */
                   const char *content, /* content string to find */
                   const size_t clen)   /* len of the content in bytes */
{
  /* RFC2616, section 4.2 says: "Each header field consists of a name followed
   * by a colon (":") and the field value. Field names are case-insensitive.
   * The field value MAY be preceded by any amount of LWS, though a single SP
   * is preferred." */

  size_t len;
  const char *start;
  const char *end;
  DEBUGASSERT(hlen);
  DEBUGASSERT(clen);
  DEBUGASSERT(header);
  DEBUGASSERT(content);

  if(!strncasecompare(headerline, header, hlen))
    return FALSE; /* doesn't start with header */

  /* pass the header */
  start = &headerline[hlen];

  /* pass all whitespace */
  while(*start && ISSPACE(*start))
    start++;

  /* find the end of the header line */
  end = strchr(start, '\r'); /* lines end with CRLF */
  if(!end) {
    /* in case there's a non-standard compliant line here */
    end = strchr(start, '\n');

    if(!end)
      /* hm, there's no line ending here, use the zero byte! */
      end = strchr(start, '\0');
  }

  len = end-start; /* length of the content part of the input line */

  /* find the content string in the rest of the line */
  for(; len >= clen; len--, start++) {
    if(strncasecompare(start, content, clen))
      return TRUE; /* match! */
  }

  return FALSE; /* no match */
}